

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

bool tinyobj::tryParseDouble(char *s,char *s_end,double *result)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  double dVar6;
  int local_44;
  bool end_not_reached;
  char *pcStack_40;
  int read;
  char *curr;
  char exp_sign;
  char sign;
  double dStack_30;
  int exponent;
  double mantissa;
  double *result_local;
  char *s_end_local;
  char *s_local;
  
  if (s_end <= s) {
    return false;
  }
  dStack_30 = 0.0;
  curr._4_4_ = 0;
  curr._3_1_ = '+';
  curr._2_1_ = '+';
  local_44 = 0;
  if ((*s == '+') || (*s == '-')) {
    curr._3_1_ = *s;
    pcStack_40 = s + 1;
  }
  else {
    iVar2 = isdigit((int)*s);
    pcStack_40 = s;
    if (iVar2 == 0) {
      return false;
    }
  }
  while( true ) {
    bVar4 = pcStack_40 != s_end;
    bVar5 = false;
    if (bVar4) {
      iVar2 = isdigit((int)*pcStack_40);
      bVar5 = iVar2 != 0;
    }
    if (!bVar5) break;
    dStack_30 = (double)(*pcStack_40 + -0x30) + dStack_30 * 10.0;
    pcStack_40 = pcStack_40 + 1;
    local_44 = local_44 + 1;
  }
  if (local_44 == 0) {
    return false;
  }
  if (bVar4) {
    if (*pcStack_40 == '.') {
      local_44 = 1;
      while( true ) {
        pcStack_40 = pcStack_40 + 1;
        bVar4 = pcStack_40 != s_end;
        bVar5 = false;
        if (bVar4) {
          iVar2 = isdigit((int)*pcStack_40);
          bVar5 = iVar2 != 0;
        }
        if (!bVar5) break;
        cVar1 = *pcStack_40;
        dVar6 = pow(10.0,(double)-local_44);
        dStack_30 = (double)(cVar1 + -0x30) * dVar6 + dStack_30;
        local_44 = local_44 + 1;
      }
    }
    else if ((*pcStack_40 != 'e') && (*pcStack_40 != 'E')) goto LAB_00137f4b;
    if ((bVar4) && ((*pcStack_40 == 'e' || (*pcStack_40 == 'E')))) {
      pcVar3 = pcStack_40 + 1;
      if ((pcVar3 == s_end) || ((*pcVar3 != '+' && (*pcVar3 != '-')))) {
        iVar2 = isdigit((int)*pcVar3);
        pcStack_40 = pcVar3;
        if (iVar2 == 0) {
          return false;
        }
      }
      else {
        curr._2_1_ = *pcVar3;
        pcStack_40 = pcStack_40 + 2;
      }
      local_44 = 0;
      while( true ) {
        bVar5 = false;
        if (pcStack_40 != s_end) {
          iVar2 = isdigit((int)*pcStack_40);
          bVar5 = iVar2 != 0;
        }
        if (!bVar5) break;
        curr._4_4_ = *pcStack_40 + -0x30 + curr._4_4_ * 10;
        pcStack_40 = pcStack_40 + 1;
        local_44 = local_44 + 1;
      }
      iVar2 = -1;
      if (curr._2_1_ == '+') {
        iVar2 = 1;
      }
      curr._4_4_ = iVar2 * curr._4_4_;
      if (local_44 == 0) {
        return false;
      }
    }
  }
LAB_00137f4b:
  iVar2 = -1;
  if (curr._3_1_ == '+') {
    iVar2 = 1;
  }
  dVar6 = pow(5.0,(double)curr._4_4_);
  dVar6 = ldexp(dStack_30 * dVar6,curr._4_4_);
  *result = (double)iVar2 * dVar6;
  return true;
}

Assistant:

static bool tryParseDouble(const char *s, const char *s_end, double *result)
{
    if (s >= s_end)
    {
        return false;
    }

    double mantissa = 0.0;
    // This exponent is base 2 rather than 10.
    // However the exponent we parse is supposed to be one of ten,
    // thus we must take care to convert the exponent/and or the 
    // mantissa to a * 2^E, where a is the mantissa and E is the
    // exponent.
    // To get the final double we will use ldexp, it requires the
    // exponent to be in base 2.
    int exponent = 0;

    // NOTE: THESE MUST BE DECLARED HERE SINCE WE ARE NOT ALLOWED
    // TO JUMP OVER DEFINITIONS.
    char sign = '+';
    char exp_sign = '+';
    char const *curr = s;

    // How many characters were read in a loop. 
    int read = 0;
    // Tells whether a loop terminated due to reaching s_end.
    bool end_not_reached = false;

    /*
        BEGIN PARSING.
    */

    // Find out what sign we've got.
    if (*curr == '+' || *curr == '-')
    {
        sign = *curr;
        curr++;
    }
    else if (isdigit(*curr)) { /* Pass through. */ }
    else
    {
        goto fail;
    }

    // Read the integer part.
    while ((end_not_reached = (curr != s_end)) && isdigit(*curr))
    {
        mantissa *= 10;
        mantissa += static_cast<int>(*curr - 0x30);
        curr++; read++;
    }

    // We must make sure we actually got something.
    if (read == 0)
        goto fail;
    // We allow numbers of form "#", "###" etc.
    if (!end_not_reached)
        goto assemble;

    // Read the decimal part.
    if (*curr == '.')
    {
        curr++;
        read = 1;
        while ((end_not_reached = (curr != s_end)) && isdigit(*curr))
        {
            // NOTE: Don't use powf here, it will absolutely murder precision.
            mantissa += static_cast<int>(*curr - 0x30) * pow(10.0, -read);
            read++; curr++;
        }
    }
    else if (*curr == 'e' || *curr == 'E') {}
    else
    {
        goto assemble;
    }

    if (!end_not_reached)
        goto assemble;

    // Read the exponent part.
    if (*curr == 'e' || *curr == 'E')
    {
        curr++;
        // Figure out if a sign is present and if it is.
        if ((end_not_reached = (curr != s_end)) && (*curr == '+' || *curr == '-'))
        {
            exp_sign = *curr;
            curr++;
        }
        else if (isdigit(*curr)) { /* Pass through. */ }
        else
        {
            // Empty E is not allowed.
            goto fail;
        }

        read = 0;
        while ((end_not_reached = (curr != s_end)) && isdigit(*curr))
        {
            exponent *= 10;
            exponent += static_cast<int>(*curr - 0x30);
            curr++; read++;
        }
        exponent *= (exp_sign == '+'? 1 : -1);
        if (read == 0)
            goto fail;
    }

assemble:
    *result = (sign == '+'? 1 : -1) * ldexp(mantissa * pow(5.0, exponent), exponent);
    return true;
fail:
    return false;
}